

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O3

Token * __thiscall Tokenizer::parseHeaderValue(Token *__return_storage_ptr__,Tokenizer *this,char c)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  char cVar3;
  _Optional_base<char,_true,_true> _Var4;
  long *plVar5;
  byte *pbVar6;
  TokenizerException *pTVar7;
  long *plVar8;
  size_type *psVar9;
  _Storage<char,_true> __rhs;
  string res;
  string local_100;
  long *local_e0;
  long local_d8;
  long local_d0;
  long lStack_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  _Variadic_union<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
  local_80;
  byte local_60 [8];
  _Variadic_union<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
  local_58;
  byte local_38 [8];
  
  paVar1 = &local_100.field_2;
  local_100._M_string_length = 0;
  local_100.field_2._M_allocated_capacity =
       local_100.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_100._M_dataplus._M_p = (pointer)paVar1;
  plVar5 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_100,0,0,'\x01');
  local_e0 = &local_d0;
  plVar8 = plVar5 + 2;
  if ((long *)*plVar5 == plVar8) {
    local_d0 = *plVar8;
    lStack_c8 = plVar5[3];
  }
  else {
    local_d0 = *plVar8;
    local_e0 = (long *)*plVar5;
  }
  local_d8 = plVar5[1];
  *plVar5 = (long)plVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != paVar1) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  _Var4._M_payload.super__Optional_payload_base<char> =
       (_Optional_payload<char,_true,_true,_true>)next(this);
  if (((ushort)_Var4._M_payload.super__Optional_payload_base<char> >> 8 & 1) == 0) {
    pTVar7 = (TokenizerException *)__cxa_allocate_exception(0x10);
    local_100._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_100,"Unexpected EOF when parsing HeaderValue in HeaderBlock","");
    TokenizerException::TokenizerException
              (pTVar7,&local_100,this->line_number,this->col_number,&this->current_line);
    __cxa_throw(pTVar7,&TokenizerException::typeinfo,std::runtime_error::~runtime_error);
  }
  if (_Var4._M_payload.super__Optional_payload_base<char>._M_payload == '\n') {
    this->col_number = this->col_number + -1;
    this->pos = this->pos + -1;
    local_58._M_rest._0_8_ = (undefined8)((long)&local_58 + 0x10);
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_58,local_e0,local_d8 + (long)local_e0);
    local_38[0] = 2;
    __return_storage_ptr__->type = HeaderValue;
    std::__detail::__variant::
    _Move_ctor_base<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
    ::_Move_ctor_base((_Move_ctor_base<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                       *)&__return_storage_ptr__->value,
                      (_Move_ctor_base<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                       *)&local_58._M_first);
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>_&>
      ::_S_vtable._M_arr[local_38[0]]._M_data)
              ((anon_class_1_0_00000001 *)&local_100,
               (variant<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                *)&local_58);
    pbVar6 = local_38;
  }
  else {
    bVar2 = false;
    do {
      __rhs._M_value = _Var4._M_payload.super__Optional_payload_base<char>._M_payload;
      if (bVar2) {
        cVar3 = doBackslash(__rhs._M_value);
        if (0x5e < (byte)(cVar3 - 0x20U)) {
          pTVar7 = (TokenizerException *)__cxa_allocate_exception(0x10);
          local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_c0,"Invalid char \"\\","");
          std::operator+(&local_a0,&local_c0,__rhs._M_value);
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_a0);
          local_100._M_dataplus._M_p = (pointer)*plVar5;
          psVar9 = (size_type *)(plVar5 + 2);
          if ((size_type *)local_100._M_dataplus._M_p == psVar9) {
            local_100.field_2._M_allocated_capacity = *psVar9;
            local_100.field_2._8_8_ = plVar5[3];
            local_100._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_100.field_2._M_allocated_capacity = *psVar9;
          }
          local_100._M_string_length = plVar5[1];
          *plVar5 = (long)psVar9;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          TokenizerException::TokenizerException
                    (pTVar7,&local_100,this->line_number,this->col_number,&this->current_line);
          __cxa_throw(pTVar7,&TokenizerException::typeinfo,std::runtime_error::~runtime_error);
        }
        std::__cxx11::string::push_back((char)&local_e0);
LAB_00108da8:
        bVar2 = false;
      }
      else {
        if (0x5e < (byte)(__rhs._M_value - 0x20U)) {
          pTVar7 = (TokenizerException *)__cxa_allocate_exception(0x10);
          local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"Invalid char \"","");
          std::operator+(&local_a0,&local_c0,__rhs._M_value);
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_a0);
          local_100._M_dataplus._M_p = (pointer)*plVar5;
          psVar9 = (size_type *)(plVar5 + 2);
          if ((size_type *)local_100._M_dataplus._M_p == psVar9) {
            local_100.field_2._M_allocated_capacity = *psVar9;
            local_100.field_2._8_8_ = plVar5[3];
            local_100._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_100.field_2._M_allocated_capacity = *psVar9;
          }
          local_100._M_string_length = plVar5[1];
          *plVar5 = (long)psVar9;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          TokenizerException::TokenizerException
                    (pTVar7,&local_100,this->line_number,this->col_number,&this->current_line);
          __cxa_throw(pTVar7,&TokenizerException::typeinfo,std::runtime_error::~runtime_error);
        }
        bVar2 = true;
        if (__rhs._M_value != '\\') {
          std::__cxx11::string::push_back((char)&local_e0);
          goto LAB_00108da8;
        }
      }
      _Var4._M_payload.super__Optional_payload_base<char> =
           (_Optional_payload<char,_true,_true,_true>)next(this);
      if (((ushort)_Var4._M_payload.super__Optional_payload_base<char> >> 8 & 1) == 0) {
        pTVar7 = (TokenizerException *)__cxa_allocate_exception(0x10);
        local_100._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_100,"Unexpected EOF when parsing HeaderValue in HeaderBlock","")
        ;
        TokenizerException::TokenizerException
                  (pTVar7,&local_100,this->line_number,this->col_number,&this->current_line);
        __cxa_throw(pTVar7,&TokenizerException::typeinfo,std::runtime_error::~runtime_error);
      }
    } while ((bool)(_Var4._M_payload.super__Optional_payload_base<char>._M_payload != '\n' | bVar2))
    ;
    this->col_number = this->col_number + -1;
    this->pos = this->pos + -1;
    local_80._M_rest._0_8_ = (undefined8)((long)&local_80 + 0x10);
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_80,local_e0,local_d8 + (long)local_e0);
    local_60[0] = 2;
    __return_storage_ptr__->type = HeaderValue;
    std::__detail::__variant::
    _Move_ctor_base<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
    ::_Move_ctor_base((_Move_ctor_base<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                       *)&__return_storage_ptr__->value,
                      (_Move_ctor_base<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                       *)&local_80._M_first);
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>_&>
      ::_S_vtable._M_arr[local_60[0]]._M_data)
              ((anon_class_1_0_00000001 *)&local_100,
               (variant<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                *)&local_80);
    pbVar6 = local_60;
  }
  *pbVar6 = 0xff;
  if (local_e0 != &local_d0) {
    operator_delete(local_e0,local_d0 + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Token Tokenizer::parseHeaderValue(char c) {
    string res = string() + c;
    optional<char> _;
    _ = next();
    if (!_.has_value()) {
        throw TokenizerException("Unexpected EOF when parsing HeaderValue in HeaderBlock", line_number, col_number,
                                 current_line);
    }
    c = _.value();
    if (c == '\n') {
        unnext();
        return Token(HeaderValue, res);
    }
    bool backslash = false;
    do {
        if (backslash) {
            backslash = false;
            char slashed = doBackslash(c);
            if (!isValidHeaderValueChar(slashed)) {
                throw TokenizerException(string("Invalid char \"\\") + c + "\" in HeaderValue", line_number, col_number,
                                         current_line);
            }
            res += slashed;
        } else {
            if (!isValidHeaderValueChar(c)) {
                throw TokenizerException(string("Invalid char \"") + c + "\" in HeaderValue", line_number, col_number,
                                         current_line);
            }
            if (c == '\\')
                backslash = true;
            else {
                backslash = false;
                res += c;
            }
        }
        _ = next();
        if (!_.has_value()) {
            throw TokenizerException("Unexpected EOF when parsing HeaderValue in HeaderBlock", line_number, col_number,
                                     current_line);
        }
        c = _.value();
    } while (c != '\n' || backslash);
    unnext();
    return Token(HeaderValue, res);
}